

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llstk.c
# Opt level: O0

void check_BF(Bframe *bf68k)

{
  Bframe *local_18;
  Bframe *iptr68k;
  Bframe *bf68k_local;
  
  if (*(ushort *)&bf68k->field_0x2 >> 0xd != 4) {
    error("checkBF:not BF1");
  }
  if ((*(ushort *)&bf68k->field_0x2 >> 9 & 1) != 1) {
    if ((bf68k->ivar & 1) == 0) {
      for (local_18 = (Bframe *)NativeAligned4FromStackOffset(bf68k->ivar); local_18 <= bf68k + -1;
          local_18 = local_18 + 1) {
        if (*(ushort *)&local_18->field_0x2 >> 0xd != 0) {
          warn("CheckBF:Stack-bits set in IVAR");
        }
      }
    }
    else {
      error("IVAR is ODD in a BF");
    }
  }
  return;
}

Assistant:

void check_BF(Bframe *bf68k) {
  Bframe *iptr68k;

  /* For starterd, it must BE a BF */
  if (bf68k->flags != STK_BF) error("checkBF:not BF1");

  /* If the frame is residual (whatever that means), it's OK */
  if (bf68k->residual == T)
    return;
  else {
    if (bf68k->ivar & 1)
      error("IVAR is ODD in a BF");
    else
      for (iptr68k = (Bframe *)NativeAligned4FromStackOffset(bf68k->ivar);
           iptr68k <= (Bframe *)(((DLword *)bf68k) - 2); iptr68k++) /* inc 2DLword */
      {
        /* Make sure none of the "ivar" slots have stack-type */
        /* bits set. */
        if (iptr68k->flags != STK_NOTFLG) warn("CheckBF:Stack-bits set in IVAR");
      }
  }

}